

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O0

void range_test(void)

{
  filemgr *blk_handle;
  btree_blk_ops *blk_ops;
  int iVar1;
  filemgr_open_result fVar2;
  filemgr_open_result result;
  char *fname;
  uint64_t key_end;
  uint64_t value;
  uint64_t key;
  filemgr_config fconfig;
  btree btree;
  btreeblk_handle bhandle;
  filemgr *file;
  int blocksize;
  int den;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  err_log_callback *in_stack_000001e8;
  filemgr_config *in_stack_000001f0;
  filemgr_ops *in_stack_000001f8;
  char *in_stack_00000200;
  err_log_callback *in_stack_00000470;
  char *in_stack_00000478;
  undefined1 in_stack_00000487;
  filemgr *in_stack_00000488;
  uint32_t in_stack_fffffffffffffe34;
  filemgr *in_stack_fffffffffffffe38;
  btreeblk_handle *handle;
  char *kv_ops;
  undefined4 in_stack_fffffffffffffe5c;
  ulong local_198;
  uint8_t in_stack_fffffffffffffe70;
  ulong in_stack_fffffffffffffe78;
  undefined4 uVar3;
  undefined4 uVar4;
  btree local_120 [3];
  filemgr *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_5c = 0x10;
  local_60 = 5;
  local_64 = 0x200;
  memset(&stack0xfffffffffffffe80,0,0x60);
  uVar4 = 0;
  uVar3 = local_64;
  local_58 = system("rm -rf  btreeblock_testfile");
  kv_ops = "./btreeblock_testfile";
  get_filemgr_ops();
  fVar2 = filemgr_open(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  blk_handle = fVar2.file;
  iVar1 = fVar2.rv;
  local_70 = blk_handle;
  btreeblk_init((btreeblk_handle *)kv_ops,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
  blk_ops = btreeblk_get_ops();
  btree_kv_get_ku64_vu64();
  handle = (btreeblk_handle *)0x0;
  btree_init((btree *)CONCAT44(in_stack_fffffffffffffe5c,iVar1),blk_handle,blk_ops,
             (btree_kv_ops *)kv_ops,0,'\0',in_stack_fffffffffffffe70,
             (bnode_flag_t)in_stack_fffffffffffffe78,(btree_meta *)CONCAT44(uVar4,uVar3));
  for (local_54 = 0; local_54 < local_5c; local_54 = local_54 + 1) {
    in_stack_fffffffffffffe78 = (ulong)local_54;
    btree_insert(local_120,&stack0xfffffffffffffe78,&stack0xfffffffffffffe70);
    btreeblk_end(handle);
  }
  for (local_54 = 0; local_54 < local_60; local_54 = local_54 + 1) {
    btree_get_key_range(local_120,(idx_t)local_54,(idx_t)local_60,&stack0xfffffffffffffe78,
                        &local_198);
    printf("%d %d\n",in_stack_fffffffffffffe78 & 0xffffffff,local_198 & 0xffffffff);
  }
  btreeblk_free((btreeblk_handle *)kv_ops);
  filemgr_close(in_stack_00000488,(bool)in_stack_00000487,in_stack_00000478,in_stack_00000470);
  filemgr_shutdown();
  if (range_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","range test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","range test");
  }
  return;
}

Assistant:

void range_test()
{
    TEST_INIT();

    int i, r, n=16, den=5;
    int blocksize = 512;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree btree;
    struct filemgr_config fconfig;
    uint64_t key, value, key_end;
    char *fname = (char *) "./btreeblock_testfile";

    memset(&fconfig, 0, sizeof(fconfig));
    fconfig.blocksize = blocksize;
    fconfig.ncacheblock = 0;
    fconfig.options = FILEMGR_CREATE;
    fconfig.num_wal_shards = 8;

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);

    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), btree_kv_get_ku64_vu64(),
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);

    for (i=0;i<n;++i){
        key = i;
        value = i*10;
        btree_insert(&btree, (void*)&key, (void*)&value);
        btreeblk_end(&bhandle);
    }

    for (i=0;i<den;++i){
        btree_get_key_range(&btree, i, den, (void*)&key, (void*)&key_end);
        DBG("%d %d\n", (int)key, (int)key_end);
    }

    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("range test");
}